

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>::templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>>
::
emplace<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>
          (sherwood_v3_table<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::BufferID,slang::Hasher<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,slang::Hasher<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,std::equal_to<slang::BufferID>>,std::allocator<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>>
           *this,pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
                 *key)

{
  bool bVar1;
  size_t hash;
  undefined8 extraout_RDX;
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>::templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_bool>
  pVar2;
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>::templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_bool>
  pVar3;
  bool local_49;
  templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
  local_48;
  char local_39;
  EntryPointer psStack_38;
  int8_t distance_from_desired;
  EntryPointer current_entry;
  size_t index;
  pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
  *key_local;
  sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>
  *this_local;
  bool local_10;
  
  index = (size_t)key;
  key_local = (pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
               *)this;
  hash = hash_object<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>
                   (this,key);
  current_entry =
       (EntryPointer)
       fibonacci_hash_policy::index_for_hash
                 ((fibonacci_hash_policy *)(this + 0x10),hash,*(size_t *)(this + 8));
  psStack_38 = (EntryPointer)(*(long *)this + (long)current_entry * 0x28);
  local_39 = '\0';
  do {
    if (psStack_38->distance_from_desired < local_39) {
      pVar2 = emplace_new_key<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>
                        (this,local_39,psStack_38,
                         (pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
                          *)index);
      local_10 = pVar2.second;
LAB_00284d8e:
      this_local = (sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>
                    *)pVar2.first.current;
      pVar3._9_7_ = pVar2._9_7_;
      pVar3.second = local_10;
      pVar3.first.current = (EntryPointer)this_local;
      return pVar3;
    }
    bVar1 = compares_equal<std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,std::pair<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>
                      (this,(pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
                             *)index,&(psStack_38->field_1).value);
    if (bVar1) {
      sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>
      ::
      templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
      ::templated_iterator(&local_48,psStack_38);
      local_49 = false;
      std::
      pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>::templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_bool>
      ::pair<bool,_true>((pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>::templated_iterator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_bool>
                          *)&this_local,&local_48,&local_49);
      pVar2._8_8_ = extraout_RDX;
      pVar2.first.current = (EntryPointer)this_local;
      goto LAB_00284d8e;
    }
    psStack_38 = psStack_38 + 1;
    local_39 = local_39 + '\x01';
  } while( true );
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }